

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O1

int nn_xreq_send_to(nn_sockbase *self,nn_msg *msg,nn_pipe **to)

{
  nn_chunkref *self_00;
  uint uVar1;
  size_t sVar2;
  undefined4 *puVar3;
  undefined4 *puVar4;
  int iVar5;
  ulong uVar6;
  
  uVar1 = nn_lb_send((nn_lb *)(self + 1),msg,to);
  if (uVar1 == 0xfffffff5) {
    return -0xb;
  }
  if (-1 < (int)uVar1) {
    return 0;
  }
  uVar6 = (ulong)uVar1;
  nn_xreq_send_to_cold_1();
  uVar1 = nn_fq_recv((nn_fq *)(uVar6 + 0x198),msg,(nn_pipe **)0x0);
  iVar5 = -0xb;
  if (uVar1 == 0xfffffff5) {
    return -0xb;
  }
  if ((int)uVar1 < 0) {
    nn_xreq_recv_cold_2();
LAB_00127911:
    nn_msg_term(msg);
  }
  else {
    if ((uVar1 & 2) == 0) {
      self_00 = &msg->body;
      sVar2 = nn_chunkref_size(self_00);
      if (sVar2 < 4) goto LAB_00127911;
      sVar2 = nn_chunkref_size(&msg->sphdr);
      if (sVar2 != 0) {
        nn_xreq_recv_cold_1();
        return -0x5c;
      }
      nn_chunkref_term(&msg->sphdr);
      nn_chunkref_init(&msg->sphdr,4);
      puVar3 = (undefined4 *)nn_chunkref_data(&msg->sphdr);
      puVar4 = (undefined4 *)nn_chunkref_data(self_00);
      *puVar3 = *puVar4;
      nn_chunkref_trim(self_00,4);
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int nn_xreq_send_to (struct nn_sockbase *self, struct nn_msg *msg,
    struct nn_pipe **to)
{
    int rc;

    /*  If request cannot be sent due to the pushback, drop it silenly. */
    rc = nn_lb_send (&nn_cont (self, struct nn_xreq, sockbase)->lb, msg, to);
    if (nn_slow (rc == -EAGAIN))
        return -EAGAIN;
    errnum_assert (rc >= 0, -rc);

    return 0;
}